

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::ClearToDefault
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  size_t sVar1;
  size_type sVar2;
  undefined1 local_30 [8];
  string_view input;
  Arena *arena_local;
  UnownedPayload *unowned_input_local;
  MicroString *this_local;
  
  input._M_str = (char *)arena;
  _local_30 = UnownedPayload::get((UnownedPayload *)&unowned_input->payload);
  if (input._M_str != (char *)0x0) {
    sVar1 = Capacity(this);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    if (sVar2 <= sVar1) {
      Set(this,_local_30,(Arena *)input._M_str);
      return;
    }
  }
  SetUnowned(this,unowned_input,(Arena *)input._M_str);
  return;
}

Assistant:

void MicroString::ClearToDefault(const UnownedPayload& unowned_input,
                                 Arena* arena) {
  auto input = unowned_input.get();
  if (arena != nullptr && Capacity() >= input.size()) {
    // If we are in an arena and the input fits in the existing capacity, use
    // that instead.
    Set(input, arena);
  } else {
    SetUnowned(unowned_input, arena);
  }
}